

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool testConn(void)

{
  int iVar1;
  uint64_t timestamp;
  ssize_t sVar2;
  size_t __n;
  sockaddr *__addr;
  C *pCVar3;
  int in_R8D;
  Socket socket;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_b8;
  in_addr addr2;
  SockAddr addr;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_68;
  Time local_44;
  
  addr.field_0._16_4_ = 0;
  addr.field_0._20_8_ = 0;
  addr.field_0._0_8_ = 0;
  addr.field_0._8_4_ = 0;
  addr.field_0._12_4_ = 0;
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
            (&local_b8,"192.168.1.73:1002");
  axl::io::SockAddr::parse(&addr,&local_b8);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_b8);
  local_b8.m_length._0_1_ = 0;
  local_b8.m_length._1_7_ = 0;
  local_b8.m_isNullTerminated = false;
  local_b8.m_p = (C *)0x0;
  local_b8.m_hdr._0_1_ = 0;
  local_b8.m_hdr._1_7_ = 0;
  axl::io::parseAddr_ip4(&addr2,&local_b8);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_b8);
  axl::io::getSockAddrString((String *)&local_b8,(sockaddr *)&addr);
  pCVar3 = local_b8.m_p;
  if (CONCAT71(local_b8.m_length._1_7_,(undefined1)local_b8.m_length) == 0) {
    pCVar3 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
  }
  printf("connecting to %s...\n",pCVar3);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_b8);
  socket.m_socket.super_File.super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h
       = (Socket)(File)0xffffffff;
  __n = 6;
  iVar1 = axl::io::psx::Socket::open(&socket.m_socket,(char *)0x2,1);
  if (((char)iVar1 != '\0') &&
     (iVar1 = axl::io::psx::Socket::connect(&socket.m_socket,(int)&addr,__addr,(socklen_t)__n),
     (char)iVar1 != '\0')) {
    do {
      timestamp = axl::sys::getTimestamp();
      axl::sys::Time::Time(&local_44,timestamp);
      axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
                (&local_68,"%h:%m:%s");
      axl::sys::Time::format((String *)&local_b8,&local_44,&local_68);
      pCVar3 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
      if (CONCAT71(local_b8.m_length._1_7_,(undefined1)local_b8.m_length) != 0) {
        pCVar3 = local_b8.m_p;
      }
      printf("%s: sending %d bytes...",pCVar3,0x14);
      axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_b8);
      axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_68);
      sVar2 = axl::io::psx::Socket::send(&socket.m_socket,0x19a970,(void *)0x14,__n,in_R8D);
      printf("%d bytes sent\n",sVar2);
      axl::sys::sleep(5000);
    } while( true );
  }
  axl::err::getLastErrorDescription();
  pCVar3 = local_b8.m_p;
  if (CONCAT71(local_b8.m_length._1_7_,(undefined1)local_b8.m_length) == 0) {
    pCVar3 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
  }
  printf("failed: %s\n",pCVar3);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_b8);
  axl::sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::~Handle
            ((Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> *)&socket);
  return false;
}

Assistant:

void
testNetworkAdapterList() {
	printf("Enumerating adapters...\n");

	sl::List<io::NetworkAdapterDesc> adapterList;
	io::enumerateNetworkAdapters(&adapterList);

	printf("%d adapters found.\n", adapterList.getCount());

	sl::Iterator<io::NetworkAdapterDesc> adapterIt = adapterList.getHead();
	for (; adapterIt; adapterIt++) {
		io::NetworkAdapterDesc* adapter = *adapterIt;

		printf("Name        = %s\n", adapter->m_name.sz());
		printf("Description = %s\n", adapter->m_description.sz());
		printf("Type        = %s\n", io::getNetworkAdapterTypeString(adapter->m_type));
		printf("Flags       = %s\n", io::getNetworkAdapterFlagString(adapter->m_flags).sz());
		printf("Mac         = %s\n", io::getMacAddressString(adapter->m_macAddress).sz());

		sl::ConstList<io::NetworkAdapterAddress> addressList = adapter->m_addressList;
		sl::ConstIterator<io::NetworkAdapterAddress> addressIt = addressList.getHead();
		for (size_t i = 1; addressIt; addressIt++, i++) {
			const io::NetworkAdapterAddress* address = *addressIt;

			uint_t family = address->m_address.m_addr.sa_family;
			printf("%-11s = %s",
				io::getSockAddrFamilyString(family),
				address->m_address.getString().sz()
			);

			if (family == AF_INET) {
				io::SockAddr netMask;
				netMask.createNetMask_ip4(address->m_netMaskBitCount);
				printf(" (mask %s)\n", netMask.getString().sz());
			} else {
				printf("/%d\n", address->m_netMaskBitCount);
			}
		}

		printf("\n");
	}

	printf("%d adapters found\n", adapterList.getCount());
}